

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O0

void ncnn::conv1x1s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float *pfVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  int size_1;
  float *r0_1;
  float k0_1;
  float *kernel0_1;
  float *img0_1;
  float *outptr_1;
  float sum3;
  float sum2;
  float sum1;
  float sum;
  int remain;
  int size;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float k3;
  float k2;
  float k1;
  float k0;
  float *kernel0;
  float *img3;
  float *img2;
  float *img1;
  float *img0;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  float *in_stack_fffffffffffffd60;
  int c;
  Mat *in_stack_fffffffffffffd68;
  Mat *in_stack_fffffffffffffd70;
  float local_268;
  int local_260;
  float *local_258;
  Mat local_240;
  float *local_208;
  Mat *local_200;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  int local_1e8;
  int local_1e4;
  Mat *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float *local_1c8;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float *local_1b0;
  Mat local_1a8;
  Mat *local_170;
  Mat local_168;
  float *local_130;
  Mat local_128;
  float *local_f0;
  Mat local_e8;
  float *local_b0;
  float *local_a8;
  int local_a0;
  float local_8c;
  Mat local_88;
  int local_4c;
  float *local_48;
  float *local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x24);
  local_34 = *(int *)(in_RSI + 0x28);
  local_38 = *(int *)(in_RSI + 0x2c);
  local_20 = in_RCX;
  local_40 = Mat::operator_cast_to_float_(in_RDX);
  local_48 = Mat::operator_cast_to_float_(local_20);
  for (local_4c = 0; local_4c < local_38; local_4c = local_4c + 1) {
    Mat::channel(in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
    if (local_48 == (float *)0x0) {
      local_268 = 0.0;
    }
    else {
      local_268 = local_48[local_4c];
    }
    local_8c = local_268;
    Mat::fill(in_stack_fffffffffffffd70,(float)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    for (local_a0 = 0; local_a0 + 3 < local_2c; local_a0 = local_a0 + 4) {
      local_a8 = Mat::operator_cast_to_float_(&local_88);
      Mat::channel(in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_e8);
      Mat::~Mat((Mat *)0x113e88);
      local_b0 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_128);
      Mat::~Mat((Mat *)0x113ed6);
      local_f0 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_168);
      Mat::~Mat((Mat *)0x113f25);
      local_130 = pfVar2;
      Mat::channel(in_stack_fffffffffffffd68,(int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      in_stack_fffffffffffffd70 = (Mat *)Mat::operator_cast_to_float_(&local_1a8);
      Mat::~Mat((Mat *)0x113f74);
      local_1b0 = local_40 + (long)(local_4c * local_2c) + (long)local_a0;
      local_1b4 = *local_1b0;
      local_1b8 = local_1b0[1];
      local_1bc = local_1b0[2];
      local_1c0 = local_1b0[3];
      local_1c8 = local_b0;
      local_1d0 = local_f0;
      local_1d8 = local_130;
      local_1e4 = local_30 * local_34;
      local_1e0 = in_stack_fffffffffffffd70;
      for (local_1e8 = local_1e4; 0 < local_1e8; local_1e8 = local_1e8 + -1) {
        local_1ec = *local_1c8 * local_1b4;
        local_1f0 = *local_1d0 * local_1b8;
        local_1f4 = *local_1d8 * local_1bc;
        local_1f8 = *(float *)&local_1e0->data * local_1c0;
        *local_a8 = local_1ec + local_1f0 + local_1f4 + local_1f8 + *local_a8;
        local_1c8 = local_1c8 + 1;
        local_1d0 = local_1d0 + 1;
        local_1d8 = local_1d8 + 1;
        local_1e0 = (Mat *)((long)&local_1e0->data + 4);
        local_a8 = local_a8 + 1;
      }
      local_170 = in_stack_fffffffffffffd70;
    }
    for (; c = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20), local_a0 < local_2c;
        local_a0 = local_a0 + 1) {
      in_stack_fffffffffffffd68 = (Mat *)Mat::operator_cast_to_float_(&local_88);
      local_200 = in_stack_fffffffffffffd68;
      Mat::channel(in_stack_fffffffffffffd68,c);
      in_stack_fffffffffffffd60 = Mat::operator_cast_to_float_(&local_240);
      Mat::~Mat((Mat *)0x1142de);
      fVar1 = local_40[(long)(local_4c * local_2c) + (long)local_a0];
      local_258 = in_stack_fffffffffffffd60;
      for (local_260 = local_30 * local_34; 0 < local_260; local_260 = local_260 + -1) {
        *(float *)&local_200->data = *local_258 * fVar1 + *(float *)&local_200->data;
        local_258 = local_258 + 1;
        local_200 = (Mat *)((long)&local_200->data + 4);
      }
      local_208 = in_stack_fffffffffffffd60;
    }
    Mat::~Mat((Mat *)0x1143fd);
  }
  return;
}

Assistant:

static void conv1x1s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch  + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            int size = outw * outh;

            int remain = size;

            for (; remain>0; remain--)
            {
                float sum = *r0 * k0;
                float sum1 = *r1 * k1;
                float sum2 = *r2 * k2;
                float sum3 = *r3 * k3;

                *outptr += sum + sum1 + sum2 + sum3;

                r0++;
                r1++;
                r2++;
                r3++;
                outptr++;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch  + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            int size = outw * outh;

            int remain = size;

            for (; remain>0; remain--)
            {
                float sum = *r0 * k0;

                *outptr += sum;

                r0++;
                outptr++;
            }

        }
    }

}